

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

Type * __thiscall
slang::ast::Compilation::getType
          (Compilation *this,bitwidth_t width,bitmask<slang::ast::IntegralFlags> flags)

{
  uint *puVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  raw_key_type *prVar5;
  pointer ppVar6;
  Type *args;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *hash_00;
  allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_> *paVar7;
  uint in_ESI;
  long in_RDI;
  PackedArrayType *type;
  iterator it;
  uint32_t key;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>,_unsigned_int_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash_1;
  uint *k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  *in_stack_fffffffffffffc98;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *in_stack_fffffffffffffca0;
  Compilation *in_stack_fffffffffffffca8;
  ConstantRange *in_stack_fffffffffffffcb0;
  BumpAllocator *in_stack_fffffffffffffcc0;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *pos0_00;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *ptVar8;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *this_00;
  equal_to<unsigned_int> *in_stack_fffffffffffffce0;
  PackedArrayType **in_stack_fffffffffffffd10;
  uint *in_stack_fffffffffffffd18;
  try_emplace_args_t *in_stack_fffffffffffffd20;
  table_element_pointer in_stack_fffffffffffffd28;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *in_stack_fffffffffffffd30;
  PackedArrayType *local_2c0;
  iterator local_2b8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_2a8;
  uint local_298;
  uint local_294;
  bitmask<slang::ast::IntegralFlags> local_281;
  PackedArrayType *local_280;
  uint *local_278;
  long local_270;
  char_pointer local_268;
  table_element_pointer local_260;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_258;
  PackedArrayType **local_240;
  uint *local_238;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *local_230;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
  local_200;
  uint *local_1e8;
  long local_1e0;
  iterator local_1d8;
  size_t local_1c8;
  uint *local_1c0;
  long local_1b8;
  uint local_1ac;
  value_type *local_1a8;
  value_type *local_1a0;
  uint local_194;
  group_type *local_190;
  size_t local_188;
  pow2_quadratic_prober local_180;
  size_t local_170;
  size_t local_168;
  uint *local_160;
  long local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>,_unsigned_int_&,_void>
  local_148;
  PackedArrayType **local_140;
  uint *local_138;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
  local_b0;
  size_t local_98;
  size_t local_90;
  ConstantRange *local_88;
  PackedArrayType **local_80;
  uint *local_78;
  undefined1 *local_70;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  ConstantRange *local_10;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  *local_8;
  
  local_298 = in_ESI;
  local_294 = in_ESI;
  bVar2 = bitmask<slang::ast::IntegralFlags>::bits(&local_281);
  local_298 = (uint)bVar2 << 0x18 | local_298;
  lVar4 = in_RDI + 0x268;
  local_278 = &local_298;
  local_270 = lVar4;
  local_1e8 = local_278;
  local_1e0 = lVar4;
  local_1c0 = local_278;
  local_1b8 = lVar4;
  local_1c8 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
              ::hash_for<unsigned_int>(in_stack_fffffffffffffca0,(uint *)in_stack_fffffffffffffc98);
  puVar1 = local_1c0;
  local_168 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
              ::position_for(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
  local_160 = puVar1;
  local_170 = local_1c8;
  local_158 = lVar4;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_180,local_168);
  do {
    local_188 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_180);
    local_190 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                ::groups((table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                          *)0x1192699);
    local_190 = local_190 + local_188;
    local_194 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
    if (local_194 != 0) {
      local_1a0 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                  ::elements((table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                              *)0x11926e4);
      local_1a8 = local_1a0 + local_188 * 0xf;
      do {
        local_1ac = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffce0 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                     *)0x1192734);
        puVar1 = local_160;
        prVar5 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
                 ::key_from<std::pair<unsigned_int_const,slang::ast::Type_const*>>
                           ((pair<const_unsigned_int,_const_slang::ast::Type_*> *)0x1192761);
        bVar3 = std::equal_to<unsigned_int>::operator()(in_stack_fffffffffffffce0,puVar1,prVar5);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
          ::table_locator(&local_200,local_190,local_1ac,local_1a8 + local_1ac);
          goto LAB_01192855;
        }
        local_194 = local_194 - 1 & local_194;
      } while (local_194 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
    if (bVar3) {
      memset(&local_200,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
      ::table_locator(&local_200);
      goto LAB_01192855;
    }
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_180,*(size_t *)(in_RDI + 0x270));
  } while (bVar3);
  memset(&local_200,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
  ::table_locator(&local_200);
LAB_01192855:
  local_1d8 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
              ::make_iterator((locator *)0x1192862);
  local_268 = local_1d8.pc_;
  local_260 = local_1d8.p_;
  local_2a8.pc_ = local_1d8.pc_;
  local_2a8.p_ = local_1d8.p_;
  local_2b8 = boost::unordered::
              unordered_flat_map<unsigned_int,_const_slang::ast::Type_*,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
              ::end((unordered_flat_map<unsigned_int,_const_slang::ast::Type_*,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                     *)0x11928c3);
  bVar3 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  if (bVar3) {
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)in_stack_fffffffffffffca0);
    local_280 = (PackedArrayType *)ppVar6->second;
  }
  else {
    args = getScalarType(in_stack_fffffffffffffca8,
                         (bitmask<slang::ast::IntegralFlags>)
                         (underlying_type)((ulong)in_stack_fffffffffffffcb0 >> 0x38));
    ConstantRange::ConstantRange((ConstantRange *)&stack0xfffffffffffffd34,local_294 - 1,0);
    local_2c0 = BumpAllocator::
                emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange,unsigned_int&>
                          (in_stack_fffffffffffffcc0,args,in_stack_fffffffffffffcb0,
                           (uint *)in_stack_fffffffffffffca8);
    hash_00 = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
               *)(in_RDI + 0x268);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>
              ((table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                *)&stack0xfffffffffffffd20,&local_2a8);
    local_238 = &local_298;
    local_240 = &local_2c0;
    pos0_00 = hash_00;
    local_230 = hash_00;
    local_140 = local_240;
    local_138 = local_238;
    local_130 = hash_00;
    paVar7 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             ::al((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                   *)0x1192a2c);
    boost::unordered::detail::foa::
    alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>,_unsigned_int_&,_void>
    ::alloc_cted_or_fwded_key_type(&local_148,paVar7,local_138);
    local_78 = boost::unordered::detail::foa::
               alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>,_unsigned_int_&,_void>
               ::move_or_fwd(&local_148);
    local_70 = &local_149;
    local_80 = local_140;
    ptVar8 = pos0_00;
    local_68 = pos0_00;
    local_88 = (ConstantRange *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
               ::key_from<unsigned_int,slang::ast::PackedArrayType*>(local_78,local_140);
    local_90 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
               ::hash_for<unsigned_int>(in_stack_fffffffffffffca0,(uint *)in_stack_fffffffffffffc98)
    ;
    local_98 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
               ::position_for(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
    local_10 = local_88;
    local_20 = local_90;
    this_00 = ptVar8;
    local_18 = local_98;
    local_8 = ptVar8;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_98);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                 ::groups((table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                           *)0x1192b65);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffca8,(size_t)in_stack_fffffffffffffca0);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                   ::elements((table_arrays<std::pair<const_unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                               *)0x1192bb0);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffca8 =
               (Compilation *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                       *)0x1192c00);
          in_stack_fffffffffffffcb0 = local_10;
          prVar5 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
                   ::key_from<std::pair<unsigned_int_const,slang::ast::Type_const*>>
                             ((pair<const_unsigned_int,_const_slang::ast::Type_*> *)0x1192c2d);
          bVar3 = std::equal_to<unsigned_int>::operator()
                            ((equal_to<unsigned_int> *)in_stack_fffffffffffffca8,
                             (uint *)in_stack_fffffffffffffcb0,prVar5);
          if (bVar3) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_01192d21;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98);
      if (bVar3) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
        ::table_locator(&local_b0);
        goto LAB_01192d21;
      }
      bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,(ptVar8->arrays).groups_size_mask);
    } while (bVar3);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>
    ::table_locator(&local_b0);
LAB_01192d21:
    bVar3 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_b0);
    if (bVar3) {
      local_c0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                 ::make_iterator((locator *)0x1192d41);
      local_c1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_258,&local_c0,&local_c1);
    }
    else if ((this_00->size_ctrl).size < (this_00->size_ctrl).ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
                (this_00,(size_t)pos0_00,(size_t)hash_00,(try_emplace_args_t *)args,
                 (uint *)in_stack_fffffffffffffcb0,(PackedArrayType **)in_stack_fffffffffffffce0);
      local_d8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                 ::make_iterator((locator *)0x1192dd9);
      local_f1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_258,&local_d8,local_f1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
                (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      local_108 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                  ::make_iterator((locator *)0x1192e4f);
      local_121[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_258,&local_108,local_121);
    }
    local_280 = local_2c0;
  }
  return (Type *)local_280;
}

Assistant:

const Type& Compilation::getType(bitwidth_t width, bitmask<IntegralFlags> flags) {
    SLANG_ASSERT(width > 0 && width <= SVInt::MAX_BITS);
    uint32_t key = width;
    key |= uint32_t(flags.bits()) << SVInt::BITWIDTH_BITS;
    auto it = vectorTypeCache.find(key);
    if (it != vectorTypeCache.end())
        return *it->second;

    SLANG_ASSERT(!isFrozen());

    auto type = emplace<PackedArrayType>(getScalarType(flags), ConstantRange{int32_t(width - 1), 0},
                                         width);
    vectorTypeCache.emplace_hint(it, key, type);
    return *type;
}